

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O1

void cppurses::System::post_event
               (unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_> *event)

{
  Event_engine *this;
  _Head_base<0UL,_cppurses::Event_*,_false> local_10;
  
  this = detail::Event_engine::get();
  local_10._M_head_impl =
       (event->_M_t).super___uniq_ptr_impl<cppurses::Event,_std::default_delete<cppurses::Event>_>.
       _M_t.super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>.
       super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl;
  (event->_M_t).super___uniq_ptr_impl<cppurses::Event,_std::default_delete<cppurses::Event>_>._M_t.
  super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>.
  super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl = (Event *)0x0;
  detail::Event_queue::append
            (&this->queue_,
             (unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_> *)&local_10);
  if (local_10._M_head_impl != (Event *)0x0) {
    (*(local_10._M_head_impl)->_vptr_Event[1])();
  }
  return;
}

Assistant:

void System::post_event(std::unique_ptr<Event> event)
{
    detail::Event_engine::get().queue().append(std::move(event));
}